

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_set_name(exr_context_t ctxt,int part_index,char *val)

{
  long lVar1;
  exr_attr_string_t *s;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  size_t __n;
  long lVar3;
  undefined8 uStackY_40;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar3 = *(long *)(lVar1 + 0x68);
      if (lVar3 == 0) {
        eVar2 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"name",EXR_ATTR_STRING,0,
                                  (uint8_t **)0x0,(exr_attribute_t **)(lVar1 + 0x68));
        lVar3 = *(long *)(lVar1 + 0x68);
      }
      else {
        eVar2 = 0;
        if (*(int *)(lVar3 + 0x14) != 0x13) {
          eVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(lVar3 + 8),"name",*(code **)(ctxt + 0x48));
          return eVar2;
        }
      }
      if ((val == (char *)0x0) || (*val == '\0')) {
        eVar2 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid string passed trying to set \'name\'");
        return eVar2;
      }
      __n = strlen(val);
      if (0x7ffffffe < __n) {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"String too large to store (%lu bytes) into \'name\'",__n,
                           *(code **)(ctxt + 0x48));
        return eVar2;
      }
      if (eVar2 != 0) {
        return eVar2;
      }
      s = *(exr_attr_string_t **)(lVar3 + 0x18);
      if ((s->length == (int)__n) && (0 < s->alloc_size)) {
        memcpy(s->str,val,__n);
        return 0;
      }
      if (*ctxt != (_priv_exr_context_t)0x1) {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,0x14,
                           "Existing string \'name\' has length %d, requested %d, unable to change",
                           s->length,__n & 0xffffffff,*(code **)(ctxt + 0x48));
        return eVar2;
      }
      eVar2 = exr_attr_string_set_with_length(ctxt,s,val,(int)__n);
      return eVar2;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 8;
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_40);
  return eVar2;
}

Assistant:

exr_result_t
exr_set_name (exr_context_t ctxt, int part_index, const char* val)
{
    size_t bytes;
    REQ_ATTR_FIND_CREATE (name, EXR_ATTR_STRING);

    if (!val || val[0] == '\0')
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string passed trying to set 'name'"));

    bytes = strlen (val);

    if (bytes >= (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into 'name'",
            (uint64_t) bytes));

    if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            /* we own the string... */
            memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string 'name' has length %d, requested %d, unable to change",
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}